

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

Result __thiscall
tonk::Connection::InitializeOutgoingConnection
          (Connection *this,Dependencies *deps,TonkSocketConfig *socketConfig,
          TonkConnectionConfig *connectionConfig,char *serverHostname,uint16_t serverPort)

{
  atomic<int> *paVar1;
  in6_addr *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  long *plVar2;
  long lVar3;
  io_context_impl *piVar4;
  ConnectionAddrMap *pCVar5;
  ConnectionIdMap *pCVar6;
  P2PConnectionKeyMap *pPVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
  *op;
  OutputWorker *pOVar11;
  undefined6 in_register_0000008a;
  resolver_service_base *this_03;
  uint16_t in_stack_00000008;
  allocator local_399;
  anon_class_8_1_8991fb9c local_398;
  ptr local_390;
  shared_ptr<asio::io_context> *local_378;
  uint8_t keyBytes [8];
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_350;
  undefined1 local_340 [392];
  LogStringBuffer local_1b8;
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)0x0;
  Dependencies::operator=(deps + 1,(Dependencies *)socketConfig);
  deps[2].SocketRefCount = (RefCounter *)connectionConfig;
  pCVar5 = *(ConnectionAddrMap **)(serverHostname + 8);
  pCVar6 = *(ConnectionIdMap **)(serverHostname + 0x10);
  pPVar7 = *(P2PConnectionKeyMap **)(serverHostname + 0x18);
  deps[2].UDPSender = *(IUDPSender **)serverHostname;
  deps[2].AddressMap = pCVar5;
  deps[2].IdMap = pCVar6;
  deps[2].P2PKeyMap = pPVar7;
  deps[2].MappedPort = *(MappedPortLifetime **)(serverHostname + 0x20);
  LOCK();
  paVar1 = &(deps[1].SocketRefCount)->RefCount;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  std::__cxx11::string::string
            ((string *)&local_1b8,(char *)CONCAT62(in_register_0000008a,serverPort),
             (allocator *)keyBytes);
  GetConnectionLogPrefix((string *)local_340,(string *)&local_1b8,in_stack_00000008);
  local_378 = &deps[2].Context;
  logger::Channel::SetPrefix((Channel *)local_378,(string *)local_340);
  std::__cxx11::string::~string((string *)local_340);
  std::__cxx11::string::~string((string *)&local_1b8);
  MakeUniqueNoThrow<asio::io_context::strand,asio::io_context&>
            ((tonk *)local_340,
             deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  uVar8 = local_340._0_8_;
  local_340._0_8_ = (ErrorResult *)0x0;
  std::__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  reset((__uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
        )&deps[0x1ca].AddressMap,(pointer)uVar8);
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  ~unique_ptr((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
               *)local_340);
  if (deps[0x1ca].AddressMap == (ConnectionAddrMap *)0x0) {
    Result::OutOfMemory();
    uVar8 = local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar8;
    Result::~Result((Result *)local_340);
  }
  else {
    MakeUniqueNoThrow<tonk::HostnameResolverState>();
    uVar8 = local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    this_00 = &deps[0x1c8].DisconnectAddrKey.impl_.data_.v6.sin6_addr;
    std::
    __uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::reset((__uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
             *)this_00,(pointer)uVar8);
    std::unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
    ::~unique_ptr((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                   *)local_340);
    **(uint16_t **)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) = in_stack_00000008;
    MakeUniqueNoThrow<asio::ip::basic_resolver<asio::ip::tcp,asio::ip::resolver_service<asio::ip::tcp>>,asio::io_context&>
              ((tonk *)local_340,
               deps[1].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    uVar8 = local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    std::
    __uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::reset((__uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)(*(long *)&this_00->__in6_u + 8),(pointer)uVar8);
    std::
    unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
    ::~unique_ptr((unique_ptr<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                   *)local_340);
    SecureRandom_Next((tonk *)local_340,keyBytes,8);
    uVar8 = local_340._0_8_;
    local_340._0_8_ = (ErrorResult *)0x0;
    (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar8;
    Result::~Result((Result *)local_340);
    if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
      deps[0x1cb].MappedPort = (MappedPortLifetime *)keyBytes;
      initSubsystems((Connection *)local_340);
      uVar8 = local_340._0_8_;
      local_340._0_8_ = (ErrorResult *)0x0;
      (this->super_IConnection)._vptr_IConnection = (_func_int **)uVar8;
      Result::~Result((Result *)local_340);
      if ((this->super_IConnection)._vptr_IConnection == (_func_int **)0x0) {
        SessionOutgoing::StartHandshakeC2SConnect
                  ((SessionOutgoing *)&deps[3].IdMap,(uint64_t)deps[0x1cb].MappedPort);
        resetTimers((Connection *)deps,
                    ((deps[2].SocketRefCount)->ShutdownLock).super___mutex_base._M_mutex.__data.
                    __owner,false);
        if (InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
            ::kAnyProtocolStr_abi_cxx11_ == '\0') {
          iVar10 = __cxa_guard_acquire(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                        ::kAnyProtocolStr_abi_cxx11_);
          if (iVar10 != 0) {
            std::__cxx11::string::string
                      ((string *)
                       &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                        ::kAnyProtocolStr_abi_cxx11_,"",(allocator *)local_340);
            __cxa_atexit(std::__cxx11::string::~string,
                         &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                          ::kAnyProtocolStr_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                                 ::kAnyProtocolStr_abi_cxx11_);
          }
        }
        LOCK();
        *(int *)&(deps->Context).super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(deps->Context).
                      super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        UNLOCK();
        plVar2 = *(long **)(*(long *)((long)&deps[0x1c8].DisconnectAddrKey.impl_.data_ + 8) + 8);
        std::__cxx11::string::string
                  ((string *)local_340,(char *)CONCAT62(in_register_0000008a,serverPort),&local_399)
        ;
        local_398.this = (Connection *)deps;
        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                  ((basic_resolver_query<asio::ip::tcp> *)&local_1b8,(string *)local_340,
                   &InitializeOutgoingConnection(tonk::Connection::Dependencies_const&,TonkSocketConfig_t_const*,TonkConnectionConfig_t_const&,char_const*,unsigned_short)
                    ::kAnyProtocolStr_abi_cxx11_,0);
        lVar3 = *plVar2;
        local_390.h = &local_398;
        op = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
              *)asio::asio_handler_allocate(0xc0);
        local_390.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        this_03 = (resolver_service_base *)(lVar3 + 0x28);
        local_390.v = op;
        std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void,void>
                  ((__weak_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_350,
                   (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 1));
        piVar4 = this_03->io_context_impl_;
        (op->super_operation).next_ = (scheduler_operation *)0x0;
        (op->super_operation).func_ =
             asio::detail::
             resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
             ::do_complete;
        (op->super_operation).task_result_ = 0;
        std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
                  (&(op->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
                   &local_350);
        asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                  (&op->query_,(basic_resolver_query<asio::ip::tcp> *)&local_1b8);
        op->io_context_impl_ = piVar4;
        (op->handler_).this = local_398.this;
        std::error_code::error_code(&op->ec_);
        op->addrinfo_ = (addrinfo_type *)0x0;
        local_390.p = op;
        std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_350._M_refcount);
        asio::detail::resolver_service_base::start_resolve_op(this_03,(operation *)op);
        local_390.v = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        local_390.p = (resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseConnection_cpp:380:13)>
                       *)0x0;
        asio::detail::
        resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseConnection.cpp:380:13)>
        ::ptr::~ptr(&local_390);
        asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
                  ((basic_resolver_query<asio::ip::tcp> *)&local_1b8);
        std::__cxx11::string::~string((string *)local_340);
        bVar9 = ConnectionIdMap::InsertAndAssignId
                          (deps[1].IdMap,(id_t *)&deps[0x1cb].Context,(IConnection *)deps);
        if (!bVar9 && *(int *)&deps[2].Context.
                               super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi < 4) {
          this_02 = &local_1b8.LogStream;
          local_1b8.ChannelName =
               (char *)(local_378->super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
          local_1b8.LogLevel = Warning;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
          std::operator<<((ostream *)this_02,(string *)&deps[2].NATPool);
          std::operator<<((ostream *)this_02,"Failed to insert new connection into map");
          pOVar11 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(pOVar11,&local_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
        }
        postNextTimer((Connection *)deps);
      }
    }
  }
  if ((this->super_IConnection)._vptr_IConnection != (_func_int **)0x0) {
    Result::ToJson_abi_cxx11_((string *)keyBytes,(Result *)this);
    if (*(int *)&deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi < 4) {
      local_340._0_8_ =
           deps[2].Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (ostringstream *)(local_340 + 0x10);
      local_340._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,(string *)&deps[2].NATPool);
      std::operator<<((ostream *)this_01,"Connection::InitializeOutgoingConnection failed: ");
      std::operator<<((ostream *)this_01,(string *)keyBytes);
      pOVar11 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar11,(LogStringBuffer *)local_340);
      std::__cxx11::ostringstream::~ostringstream(this_01);
    }
    std::__cxx11::string::~string((string *)keyBytes);
    Shutdown((Connection *)deps);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result Connection::InitializeOutgoingConnection(
    const Dependencies& deps,
    const TonkSocketConfig* socketConfig,
    const TonkConnectionConfig& connectionConfig,
    const char* serverHostname,
    uint16_t serverPort)
{
    Result result;

    try
    {
        Deps = deps;
        SocketConfig = socketConfig;
        ConnectionConfig = connectionConfig;

        // Add reference to socket
        Deps.SocketRefCount->IncrementReferences();

        Logger.SetPrefix(GetConnectionLogPrefix(serverHostname, serverPort));

        AsioEventStrand = MakeUniqueNoThrow<asio::io_context::strand>(*Deps.Context);
        if (!AsioEventStrand)
        {
            result = Result::OutOfMemory();
            goto OnError;
        }

        ResolverState = MakeUniqueNoThrow<HostnameResolverState>();
        ResolverState->ServerUDPPort = serverPort;
        ResolverState->Resolver = MakeUniqueNoThrow<asio::ip::tcp::resolver>(*Deps.Context);

#ifdef TONK_DISABLE_OUTGOING_ENCRYPTION
        EncryptionKey = 0;
#else // TONK_DISABLE_OUTGOING_ENCRYPTION
        uint8_t keyBytes[8];
        result = SecureRandom_Next(keyBytes, 8);
        if (result.IsFail()) {
            goto OnError;
        }
        EncryptionKey = siamese::ReadU64_LE(keyBytes);
#endif // TONK_DISABLE_OUTGOING_ENCRYPTION

        result = initSubsystems();
        if (result.IsFail()) {
            goto OnError;
        }

        // Start attaching handshake to each outgoing datagram
        Outgoing.StartHandshakeC2SConnect(EncryptionKey);

        // Initialize timers for outgoing connection
        resetTimers(SocketConfig->ConnectionTimeoutUsec, false);

        //----------------------------------------------------------------------
        // Connection creation cannot fail past this point
        //----------------------------------------------------------------------

        // Allow any protocol
        static const std::string kAnyProtocolStr = "";

        // Kick off async resolve after initialization
        SelfRefCount.IncrementReferences();
        ResolverState->Resolver->async_resolve(serverHostname, kAnyProtocolStr,
            [this](const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
        {
            onResolve(error, results);
            SelfRefCount.DecrementReferences();
        });

        /*
            This is the right time to assign a Connection Id, before any
            messages are queued for delivery to the peer.

            The Connection Id is used to reconnect if the source IP address or
            port changes during a connection.  Both client and server in a
            connection are assigned a Connection Id by the other side.
            And both peers are able to change their source address by sending
            a valid datagram with the ID flag set.
        */
        if (!Deps.IdMap->InsertAndAssignId(LocallyAssignedIdForRemoteHost, this))
        {
            // Id assignment can only fail if too many clients were allowed to
            // connect, which should not be possible.
            TONK_DEBUG_BREAK();
            Logger.Warning("Failed to insert new connection into map");
        }

        postNextTimer();

        /*
            Do not immediately flush queued messages - The application decides
            when to flush the initial data so that it can be included in the
            first connection request datagram to the server.
        */
    }
    catch (...)
    {
        TONK_DEBUG_BREAK(); // Should never happen except out of memory error
        result = Result("Connection::InitializeOutgoingConnection", "Exception!", ErrorType::Tonk);
    }

OnError:
    if (result.IsFail())
    {
        Logger.Warning("Connection::InitializeOutgoingConnection failed: ", result.ToJson());
        Shutdown();
    }

    return result;
}